

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

void __thiscall
booster::aio::stream_socket::async_read_some
          (stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  atomic_counter *this_00;
  callable<void_(const_std::error_code_&,_unsigned_long)> *pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  size_t n;
  pointer_type pVar4;
  io_service *this_01;
  pointer reader;
  error_code e;
  event_handler local_58;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> local_50;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> local_48;
  error_code local_40;
  
  bVar3 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar3) {
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
    n = read_some(this,buffer,&local_40);
    if ((local_40._M_value != 0) && (bVar3 = basic_io_device::would_block(&local_40), bVar3)) {
      pVar4.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x50);
      ((pVar4.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cfeb0;
      this_00 = &((pVar4.p_)->super_refcounted).refs_;
      atomic_counter::atomic_counter(this_00,0);
      ((pVar4.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__reader_some_001d0300;
      pcVar1 = (h->call_ptr).p_;
      pVar4.p_[1].super_refcounted._vptr_refcounted = (_func_int **)pcVar1;
      if (pcVar1 != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
        atomic_counter::inc((atomic_counter *)(pcVar1 + 8));
      }
      pVar4.p_[2].super_refcounted.refs_.value_.super___atomic_base<long>._M_i =
           (buffer->super_buffer_impl<char_*>).entry_.size;
      pp_Var2 = (_func_int **)(buffer->super_buffer_impl<char_*>).entry_.ptr;
      pVar4.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i =
           *(__int_type *)&buffer->super_buffer_impl<char_*>;
      pVar4.p_[2].super_refcounted._vptr_refcounted = pp_Var2;
      std::
      vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::vector((vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                *)(pVar4.p_ + 3),&(buffer->super_buffer_impl<char_*>).vec_);
      pVar4.p_[4].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)this;
      local_48.p_ = (reader_some *)pVar4.p_;
      atomic_counter::inc(this_00);
      local_50.p_ = (reader_some *)pVar4.p_;
      atomic_counter::inc(this_00);
      local_58.call_ptr.p_ = (pointer_type)(pointer_type)pVar4.p_;
      atomic_counter::inc(this_00);
      basic_io_device::on_readable((basic_io_device *)this,&local_58);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_58.call_ptr);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr(&local_50);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr(&local_48);
      return;
    }
    this_01 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(this_01,h,&local_40,n);
  }
  return;
}

Assistant:

void stream_socket::async_read_some(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	#ifdef BOOSTER_AIO_FORCE_POLL
	reader_some::pointer reader(new reader_some(h,buffer,this));
	on_readable(reader);
	#else
	system::error_code e;
	size_t n = read_some(buffer,e);
	if(e &&  would_block(e)) {
		reader_some::pointer reader(new reader_some(h,buffer,this));
		on_readable(reader);
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif
}